

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_count.hpp
# Opt level: O0

void __thiscall
boost::detail::shared_count::shared_count<boost::iostreams::detail::file_descriptor_impl>
          (shared_count *this,file_descriptor_impl *p)

{
  sp_counted_impl_p<boost::iostreams::detail::file_descriptor_impl> *this_00;
  file_descriptor_impl *p_local;
  shared_count *this_local;
  
  this->pi_ = (sp_counted_base *)0x0;
  this_00 = (sp_counted_impl_p<boost::iostreams::detail::file_descriptor_impl> *)operator_new(0x18);
  sp_counted_impl_p<boost::iostreams::detail::file_descriptor_impl>::sp_counted_impl_p(this_00,p);
  this->pi_ = (sp_counted_base *)this_00;
  return;
}

Assistant:

explicit shared_count( Y * p ): pi_( 0 )
#if defined(BOOST_SP_ENABLE_DEBUG_HOOKS)
        , id_(shared_count_id)
#endif
    {
#ifndef BOOST_NO_EXCEPTIONS

        try
        {
            pi_ = new sp_counted_impl_p<Y>( p );
        }
        catch(...)
        {
            boost::checked_delete( p );
            throw;
        }

#else

        pi_ = new sp_counted_impl_p<Y>( p );

        if( pi_ == 0 )
        {
            boost::checked_delete( p );
            boost::throw_exception( std::bad_alloc() );
        }

#endif
    }